

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

FConfigEntry * __thiscall
FConfigFile::ReadMultiLineValue
          (FConfigFile *this,void *file,FConfigSection *section,char *key,char *endtag)

{
  char cVar1;
  int iVar2;
  size_t __n;
  undefined4 extraout_var;
  char *pcVar3;
  FConfigEntry *pFVar4;
  FConfigFile *this_00;
  FString value;
  char readbuf [4096];
  undefined1 local_1050 [16];
  FConfigSection *local_1040;
  char local_1038;
  char local_1037;
  char local_1036;
  FConfigFile local_1035 [73];
  
  local_1050._0_8_ = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_1050._8_8_ = section;
  local_1040 = (FConfigSection *)key;
  __n = strlen(endtag);
  do {
    this_00 = this;
    iVar2 = (*this->_vptr_FConfigFile[3])(this,&local_1038,0x1000,file);
    if (CONCAT44(extraout_var,iVar2) == 0) goto LAB_0042f370;
    if (((local_1038 == '>') && (local_1037 == '>')) && (local_1036 == '>')) {
      this_00 = local_1035;
      iVar2 = strncmp((char *)this_00,endtag,__n);
      if (iVar2 == 0) {
        pcVar3 = (char *)((long)&local_1035[0]._vptr_FConfigFile + __n);
        while( true ) {
          cVar1 = *pcVar3;
          if ((cVar1 != '\n') && (cVar1 != '\r')) break;
          pcVar3 = pcVar3 + 1;
        }
        if (cVar1 == '\0') {
          this_00 = (FConfigFile *)local_1050;
          FString::StripRight((FString *)this_00,"\n\r");
        }
LAB_0042f370:
        pFVar4 = NewConfigEntry(this_00,(FConfigSection *)local_1050._8_8_,(char *)local_1040,
                                (char *)local_1050._0_8_);
        FString::~FString((FString *)local_1050);
        return pFVar4;
      }
    }
    FString::operator+=((FString *)local_1050,&local_1038);
  } while( true );
}

Assistant:

FConfigFile::FConfigEntry *FConfigFile::ReadMultiLineValue(void *file, FConfigSection *section, const char *key, const char *endtag)
{
	char readbuf[READBUFFERSIZE];
	FString value;
	size_t endlen = strlen(endtag);

	// Keep on reading lines until we reach a line that matches >>>endtag
	while (ReadLine(readbuf, READBUFFERSIZE, file) != NULL)
	{
		// Does the start of this line match the endtag?
		if (readbuf[0] == '>' && readbuf[1] == '>' && readbuf[2] == '>' &&
			strncmp(readbuf + 3, endtag, endlen) == 0)
		{ // Is there nothing but line break characters after the match?
			size_t i;
			for (i = endlen + 3; readbuf[i] != '\0'; ++i)
			{
				if (readbuf[i] != '\n' && readbuf[i] != '\r')
				{ // Not a line break character
					break;
				}
			}
			if (readbuf[i] == '\0')
			{ // We're done; strip the previous line's line breaks, since it's not part of the value.
				value.StripRight("\n\r");
			}
			break;
		}
		// Append this line to the value.
		value << readbuf;
	}
	return NewConfigEntry(section, key, value);
}